

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

void co_set_env_list(char **name,size_t cnt)

{
  int iVar1;
  char *pcVar2;
  stCoSysEnv_t *psVar3;
  stCoSysEnv_t *psVar4;
  ulong local_38;
  size_t i_1;
  stCoSysEnv_t *lq;
  stCoSysEnv_t *lp;
  size_t i;
  size_t cnt_local;
  char **name_local;
  
  if (g_co_sysenv.data == (stCoSysEnv_t *)0x0) {
    g_co_sysenv.data = (stCoSysEnv_t *)calloc(1,cnt << 4);
    for (lp = (stCoSysEnv_t *)0x0; lp < cnt; lp = (stCoSysEnv_t *)((long)&lp->name + 1)) {
      if ((name[(long)lp] != (char *)0x0) && (*name[(long)lp] != '\0')) {
        pcVar2 = strdup(name[(long)lp]);
        psVar3 = g_co_sysenv.data + g_co_sysenv.cnt;
        g_co_sysenv.cnt = g_co_sysenv.cnt + 1;
        psVar3->name = pcVar2;
      }
    }
    if (1 < g_co_sysenv.cnt) {
      qsort(g_co_sysenv.data,g_co_sysenv.cnt,0x10,co_sysenv_comp);
      lq = g_co_sysenv.data;
      psVar3 = g_co_sysenv.data;
      for (local_38 = 1; i_1 = (size_t)(psVar3 + 1), local_38 < g_co_sysenv.cnt;
          local_38 = local_38 + 1) {
        iVar1 = strcmp(lq->name,*(char **)i_1);
        psVar4 = lq;
        if ((iVar1 != 0) && (psVar4 = lq + 1, (stCoSysEnv_t *)i_1 != psVar4)) {
          psVar4->name = *(char **)i_1;
          lq[1].value = psVar3[1].value;
        }
        lq = psVar4;
        psVar3 = (stCoSysEnv_t *)i_1;
      }
      g_co_sysenv.cnt = ((long)lq - (long)g_co_sysenv.data >> 4) + 1;
    }
  }
  return;
}

Assistant:

void co_set_env_list( const char *name[],size_t cnt)
{
	if( g_co_sysenv.data )
	{
		return ;
	}
	g_co_sysenv.data = (stCoSysEnv_t*)calloc( 1,sizeof(stCoSysEnv_t) * cnt  );

	for(size_t i=0;i<cnt;i++)
	{
		if( name[i] && name[i][0] )
		{
			g_co_sysenv.data[ g_co_sysenv.cnt++ ].name = strdup( name[i] );
		}
	}
	if( g_co_sysenv.cnt > 1 )
	{
		qsort( g_co_sysenv.data,g_co_sysenv.cnt,sizeof(stCoSysEnv_t),co_sysenv_comp );
		stCoSysEnv_t *lp = g_co_sysenv.data;
		stCoSysEnv_t *lq = g_co_sysenv.data + 1;
		for(size_t i=1;i<g_co_sysenv.cnt;i++)
		{
			if( strcmp( lp->name,lq->name ) )
			{
				++lp;
				if( lq != lp  )
				{
					*lp = *lq;
				}
			}
			++lq;
		}
		g_co_sysenv.cnt = lp - g_co_sysenv.data + 1;
	}

}